

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall psy::C::Parser::ignoreDeclarationOrDefinition(Parser *this)

{
  uint uVar1;
  SyntaxToken *pSVar2;
  ulong uVar3;
  
  do {
    pSVar2 = SyntaxTree::tokenAt(this->tree_,(ulong)this->curTkIdx_);
    uVar3 = (ulong)pSVar2->syntaxK_;
    if (uVar3 < 0x3b) {
      if ((0x6c2430040000001U >> (uVar3 & 0x3f) & 1) != 0) {
        return false;
      }
      if ((0x20400000UL >> (uVar3 & 0x3f) & 1) != 0) {
        this->curTkIdx_ = this->curTkIdx_ + 1;
        return false;
      }
    }
    uVar1 = pSVar2->syntaxK_ - 0x6e;
    if ((uVar1 < 0x13) && ((0x48007U >> (uVar1 & 0x1f) & 1) != 0)) {
      return false;
    }
    this->curTkIdx_ = this->curTkIdx_ + 1;
  } while( true );
}

Assistant:

bool Parser::ignoreDeclarationOrDefinition()
{
    while (true) {
        switch (peek().kind()) {
            // Just return.
            case SyntaxKind::EndOfFile:
            case SyntaxKind::Keyword_typedef:
            case SyntaxKind::Keyword_extern:
            case SyntaxKind::Keyword_static:
            case SyntaxKind::Keyword__Thread_local:
            case SyntaxKind::Keyword_ExtGNU___thread:
            case SyntaxKind::Keyword_auto:
            case SyntaxKind::Keyword_register:
            case SyntaxKind::Keyword_inline:
            case SyntaxKind::Keyword__Noreturn:
            case SyntaxKind::Keyword_struct:
            case SyntaxKind::Keyword_union:
            case SyntaxKind::Keyword_enum:
            case SyntaxKind::Keyword__Static_assert:
            case SyntaxKind::Keyword_ExtGNU___asm__:
                return false;

            // Skip and return.
            case SyntaxKind::SemicolonToken:
            case SyntaxKind::CloseBraceToken:
                consume();
                return false;

            // Skip.
            default:
                consume();
        }
    }
}